

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

bool Js::JavascriptNumber::TryGetInt32OrUInt32Value(double value,int32 *int32Value,bool *isInt32)

{
  code *pcVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  bool bVar6;
  
  if (int32Value == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x72,"(int32Value)","int32Value");
    if (!bVar3) goto LAB_00ce8a97;
    *puVar5 = 0;
  }
  if (isInt32 == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x73,"(isInt32)","isInt32");
    if (!bVar3) {
LAB_00ce8a97:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (value <= 0.0) {
    bVar6 = TryGetInt32Value<false>(value,int32Value);
    bVar3 = bVar6;
  }
  else {
    iVar4 = (int)(long)value;
    dVar2 = (double)((long)value & 0xffffffff);
    if ((dVar2 != value) || (NAN(dVar2) || NAN(value))) {
      return (bool)(-(dVar2 == value) & 1);
    }
    *int32Value = iVar4;
    bVar6 = -1 < iVar4;
    bVar3 = true;
  }
  *isInt32 = bVar6;
  return bVar3;
}

Assistant:

bool JavascriptNumber::TryGetInt32OrUInt32Value(const double value, int32 *const int32Value, bool *const isInt32)
    {
        Assert(int32Value);
        Assert(isInt32);

        if(value <= 0)
        {
            return *isInt32 = TryGetInt32Value(value, int32Value);
        }

        const uint32 i = static_cast<uint32>(value);
        if(static_cast<double>(i) != value)
        {
            return false;
        }

        *int32Value = i;
        *isInt32 = static_cast<int32>(i) >= 0;
        return true;
    }